

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O2

void __thiscall t_json_generator::write_number<long>(t_json_generator *this,long n)

{
  string local_30;
  
  number_to_string<long>(&local_30,this,n);
  std::operator<<((ostream *)&this->f_json_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void write_number(T n) {
    f_json_ << number_to_string(n);
  }